

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O1

compile_errcode __thiscall
ValueArgumentList::Action
          (ValueArgumentList *this,vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  iterator __position;
  bool bVar1;
  int iVar2;
  char cVar3;
  SymbolName SVar4;
  compile_errcode cVar5;
  ulong in_RAX;
  ulong uVar6;
  int iVar7;
  SymbolType expression_type;
  undefined8 uStack_38;
  
  iVar7 = 0;
  uStack_38 = in_RAX;
  do {
    uVar6 = in_RAX & 0xffffffff;
    SVar4 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (iVar7 == 2) {
      cVar5 = Expression::Action(&this->m_expression,(SymbolType *)((long)&uStack_38 + 4));
      if (cVar5 == 0) {
LAB_001304a1:
        __position._M_current =
             (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<_SymbolType,std::allocator<_SymbolType>>::
          _M_realloc_insert<_SymbolType_const&>
                    ((vector<_SymbolType,std::allocator<_SymbolType>> *)argument_type,__position,
                     (_SymbolType *)((long)&uStack_38 + 4));
        }
        else {
          *__position._M_current = uStack_38._4_4_;
          (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        in_RAX = 1;
        iVar2 = 1;
LAB_001304d0:
        iVar7 = iVar2;
        bVar1 = true;
        cVar3 = (char)in_RAX;
        in_RAX = uVar6;
        if (cVar3 == '\0') {
          SymbolQueue::NextSymbol(handle_correct_queue);
        }
      }
      else {
        iVar7 = 2;
LAB_0013049c:
        bVar1 = false;
        in_RAX = 0xffffffff;
      }
    }
    else if (iVar7 == 1) {
      in_RAX = 0;
      iVar7 = 1;
      bVar1 = false;
      iVar2 = 2;
      if (SVar4 == COMMA_SYM) goto LAB_001304d0;
    }
    else {
      iVar7 = 0;
      bVar1 = false;
      in_RAX = 0;
      if (SVar4 != R_CIRCLE_BRACKET_SYM) {
        cVar5 = Expression::Action(&this->m_expression,(SymbolType *)((long)&uStack_38 + 4));
        if (cVar5 == 0) goto LAB_001304a1;
        iVar7 = 0;
        goto LAB_0013049c;
      }
    }
    if (!bVar1) {
      return (compile_errcode)in_RAX;
    }
  } while( true );
}

Assistant:

compile_errcode ValueArgumentList::Action(vector<SymbolType>& argument_type) {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    argument_type.push_back(expression_type);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COMMA_SYM) {
                    state = 2;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 2: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    argument_type.push_back(expression_type);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        if (state != 1)
            handle_correct_queue->NextSymbol();
    }
}